

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O1

void __thiscall
ConfidentialValue_Constractor_Test::TestBody(ConfidentialValue_Constractor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  int64_t satoshi;
  AssertionResult gtest_ar_2;
  ConfidentialValue value;
  AssertHelper local_70;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  undefined1 local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  AssertHelper local_38;
  ConfidentialValue local_30;
  
  cfd::core::ConfidentialValue::ConfidentialValue(&local_30);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_58,&local_30);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_68,"value.GetHex().c_str()","\"\"",(char *)local_58,"");
  if (local_58 != (undefined1  [8])local_48) {
    operator_delete((void *)local_58);
  }
  if (local_68.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (local_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::GetData((ByteData *)local_58,&local_30);
  local_70.data_ = (AssertHelperData *)cfd::core::ByteData::GetDataSize((ByteData *)local_58);
  local_38.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_68,"value.GetData().GetDataSize()","0",(unsigned_long *)&local_70,
             (int *)&local_38);
  if (local_58 != (undefined1  [8])0x0) {
    operator_delete((void *)local_58);
  }
  if (local_68.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_58);
    if (local_60.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = cfd::core::ConfidentialValue::HasBlinding(&local_30);
  local_68.ptr_._0_1_ = (internal)bVar1;
  local_70.data_ = local_70.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)local_58,"value.HasBlinding()","false",(bool *)&local_68,(bool *)&local_70)
  ;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)CONCAT71(local_50.ptr_._1_7_,local_50.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(local_50.ptr_._1_7_,local_50.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_68.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_68.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_68.ptr_ + 8))();
      }
      local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      AVar3 = cfd::core::ConfidentialValue::GetAmount(&local_30);
      local_58 = (undefined1  [8])AVar3.amount_;
      local_50.ptr_._0_1_ = AVar3.ignore_check_;
      local_68.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cfd::core::Amount::GetSatoshiValue((Amount *)local_58);
    }
  }
  else {
    testing::Message::Message((Message *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x19,
               "Expected: (satoshi = value.GetAmount().GetSatoshiValue()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_58 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      local_58 = (undefined1  [8])0x0;
    }
  }
  local_70.data_ = local_70.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_58,"satoshi","0",(long *)&local_68,(int *)&local_70);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)CONCAT71(local_50.ptr_._1_7_,local_50.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(local_50.ptr_._1_7_,local_50.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_70.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_70.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_70.data_ + 8))();
      }
      local_70.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_006a2070;
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor) {
  ConfidentialValue value;

  EXPECT_STREQ(value.GetHex().c_str(), "");
  EXPECT_EQ(value.GetData().GetDataSize(), 0);
  EXPECT_EQ(value.HasBlinding(), false);
  int64_t satoshi = 0;
  EXPECT_NO_THROW((satoshi = value.GetAmount().GetSatoshiValue()));
  EXPECT_EQ(satoshi, 0);
}